

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void WriteVars(FSerializer *file,SDWORD *vars,size_t count,char *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    if (count == uVar3) {
      return;
    }
    if (vars[uVar3] != 0) break;
    uVar3 = uVar3 + 1;
  }
  uVar1 = count - 1;
  do {
    uVar2 = uVar1;
    if (uVar2 <= uVar3) break;
    uVar1 = uVar2 - 1;
  } while (vars[uVar2] == 0);
  FSerializer::Array<int>(file,key,vars,(int)uVar2 + 1,false);
  return;
}

Assistant:

static void WriteVars (FSerializer &file, SDWORD *vars, size_t count, const char *key)
{
	size_t i, j;

	for (i = 0; i < count; ++i)
	{
		if (vars[i] != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-zero var. Anything beyond the last stored variable
		// will be zeroed at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j] != 0)
				break;
		}
		file.Array(key, vars, int(j+1));
	}
}